

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TypeValidator::validateSingleVariable
          (TypeValidator *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  InterfaceBlock *pIVar1;
  TestContext *this_00;
  int iVar2;
  DataType DVar3;
  DataType DVar4;
  char *pcVar5;
  size_t sVar6;
  undefined1 local_1a8 [8];
  _func_int **local_1a0;
  TestLog local_198 [13];
  ios_base local_130 [264];
  
  pIVar1 = (path->
           super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           )._M_impl.super__Vector_impl_data._M_finish[-1].m_data.block;
  local_1a8 = (undefined1  [8])
              ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"Verifying type, expecting ",0x1a);
  pcVar5 = glu::getDataTypeName((pIVar1->layout).offset);
  iVar2 = (int)(ostringstream *)&local_1a0;
  if (pcVar5 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)local_1a0[-3]);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,pcVar5,sVar6);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  DVar4 = (pIVar1->layout).offset;
  DVar3 = glu::getDataTypeFromGLType(propValue);
  if (DVar4 != DVar3) {
    local_1a8 = (undefined1  [8])
                ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"\tError, got ",0xc);
    DVar4 = glu::getDataTypeFromGLType(propValue);
    pcVar5 = glu::getDataTypeName(DVar4);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear(iVar2 + (int)local_1a0[-3]);
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,pcVar5,sVar6);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
    std::ios_base::~ios_base(local_130);
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"resource type invalid","");
    this_00 = (this->super_SingleVariableValidator).super_PropValidator.m_testCtx;
    if (this_00->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,(char *)local_1a8);
    }
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,(ulong)((long)&(local_198[0].m_log)->flags + 1));
    }
  }
  return;
}

Assistant:

void TypeValidator::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	const glu::VarType* variable = path.back().getVariableType();

	DE_UNREF(resource);
	DE_UNREF(implementationName);

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying type, expecting " << glu::getDataTypeName(variable->getBasicType()) << tcu::TestLog::EndMessage;

	if (variable->getBasicType() != glu::getDataTypeFromGLType(propValue))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << glu::getDataTypeName(glu::getDataTypeFromGLType(propValue)) << tcu::TestLog::EndMessage;
		setError("resource type invalid");
	}
}